

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update_segment.cpp
# Opt level: O3

void __thiscall
duckdb::UpdateSegment::CleanupUpdateInternal
          (UpdateSegment *this,StorageLockKey *lock,UpdateInfo *info)

{
  data_ptr_t pdVar1;
  idx_t iVar2;
  UndoBufferReference pin;
  UndoBufferPointer prev;
  UndoBufferPointer next;
  UndoBufferReference local_50;
  UndoBufferPointer local_28;
  UndoBufferPointer local_18;
  
  local_28.entry = (info->prev).entry;
  local_28.position = (info->prev).position;
  UndoBufferPointer::Pin(&local_50,&local_28);
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&local_50.handle.node);
  pdVar1 = (local_50.handle.node.ptr)->buffer;
  iVar2 = (info->next).position;
  *(UndoBufferEntry **)(pdVar1 + local_50.position + 0x38) = (info->next).entry;
  *(idx_t *)(pdVar1 + local_50.position + 0x38 + 8) = iVar2;
  BufferHandle::~BufferHandle(&local_50.handle);
  if ((info->next).entry != (UndoBufferEntry *)0x0) {
    local_18.entry = (info->next).entry;
    local_18.position = (info->next).position;
    UndoBufferPointer::Pin(&local_50,&local_18);
    optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&local_50.handle.node);
    pdVar1 = (local_50.handle.node.ptr)->buffer;
    *(UndoBufferEntry **)(pdVar1 + local_50.position + 0x28) = local_28.entry;
    *(idx_t *)(pdVar1 + local_50.position + 0x28 + 8) = local_28.position;
    BufferHandle::~BufferHandle(&local_50.handle);
  }
  return;
}

Assistant:

void UpdateSegment::CleanupUpdateInternal(const StorageLockKey &lock, UpdateInfo &info) {
	D_ASSERT(info.HasPrev());
	auto prev = info.prev;
	{
		auto pin = prev.Pin();
		auto &prev_info = UpdateInfo::Get(pin);
		prev_info.next = info.next;
	}
	if (info.HasNext()) {
		auto next = info.next;
		auto next_pin = next.Pin();
		auto &next_info = UpdateInfo::Get(next_pin);
		next_info.prev = prev;
	}
}